

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

string * __thiscall
glcts::ViewportArray::DrawTestBase::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestBase *this)

{
  GLchar *__s;
  allocator<char> local_1a;
  undefined1 local_19;
  DrawTestBase *local_18;
  DrawTestBase *this_local;
  string *result;
  
  __s = getVertexShader::source;
  local_19 = 0;
  local_18 = this;
  this_local = (DrawTestBase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestBase::getVertexShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    /* empty */;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}